

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O3

RK_S32 vpu_api_sendframe(VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  RK_S32 RVar1;
  char *pcVar2;
  
  if (ctx == (VpuCodecContext *)0x0) {
    pcVar2 = "vpu_api_decode fail, input invalid";
  }
  else {
    if ((VpuApiLegacy *)ctx->vpuApiObj != (VpuApiLegacy *)0x0) {
      RVar1 = VpuApiLegacy::encoder_sendframe((VpuApiLegacy *)ctx->vpuApiObj,ctx,aEncInStrm);
      return RVar1;
    }
    pcVar2 = "vpu_api_sendframe fail, vpu api invalid";
  }
  _mpp_log_l(4,"vpu_api",pcVar2,0);
  return -1;
}

Assistant:

static RK_S32
vpu_api_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    if (ctx == NULL) {
        mpp_log("vpu_api_decode fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }

    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_sendframe fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    return api->encoder_sendframe(ctx, aEncInStrm);
}